

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall kratos::SortInitialVisitor::visit(SortInitialVisitor *this,Generator *top)

{
  undefined1 local_38 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> new_stmts;
  
  std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
  vector<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>const*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>,void>
            ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>> *)
             local_38,(top->stmts_).
                      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
             (top->stmts_).
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (allocator_type *)
             ((long)&new_stmts.
                     super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SortInitialVisitor::visit(kratos::Generator*)::_lambda(auto:1_const&,auto:2_const&)_1_>>
            (local_38,new_stmts.
                      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  operator=(&top->stmts_,
            (vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             *)local_38);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          local_38);
  return;
}

Assistant:

void visit(Generator* top) override {
        auto const& stmts = top->get_all_stmts();
        auto new_stmts = std::vector<std::shared_ptr<Stmt>>(stmts.begin(), stmts.end());

        // move initialize to the last
        std::stable_sort(
            new_stmts.begin(), new_stmts.end(),
            [](const auto& left, const auto& right) { return get_order(left) < get_order(right); });

        top->set_stmts(new_stmts);
    }